

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateTestSession(anon_unknown_0 *this,uint32_t number)

{
  int iVar1;
  SSL_METHOD *meth;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> _Var2;
  UniquePtr<SSL_SESSION> ret;
  UniquePtr<SSL_CTX> ssl_ctx;
  uint8_t id [32];
  
  meth = (SSL_METHOD *)TLS_method();
  ssl_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ssl_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)SSL_SESSION_new();
    if ((tuple<ssl_session_st_*,_bssl::internal::Deleter>)
        ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
      *(undefined8 *)this = 0;
    }
    else {
      id[8] = '\0';
      id[9] = '\0';
      id[10] = '\0';
      id[0xb] = '\0';
      id[0xc] = '\0';
      id[0xd] = '\0';
      id[0xe] = '\0';
      id[0xf] = '\0';
      id[0x10] = '\0';
      id[0x11] = '\0';
      id[0x12] = '\0';
      id[0x13] = '\0';
      id[0x14] = '\0';
      id[0x15] = '\0';
      id[0x16] = '\0';
      id[0x17] = '\0';
      id[0x18] = '\0';
      id[0x19] = '\0';
      id[0x1a] = '\0';
      id[0x1b] = '\0';
      id[0x1c] = '\0';
      id[0x1d] = '\0';
      id[0x1e] = '\0';
      id[0x1f] = '\0';
      id[4] = '\0';
      id[5] = '\0';
      id[6] = '\0';
      id[7] = '\0';
      id._0_4_ = number;
      iVar1 = SSL_SESSION_set1_id((SSL_SESSION *)
                                  ret._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,id,
                                  0x20);
      _Var2._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
           (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
           (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
           ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      if (iVar1 == 0) {
        _Var2._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
             (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
      }
      else {
        ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
      }
      *(tuple<ssl_session_st_*,_bssl::internal::Deleter> *)this =
           _Var2._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ssl_ctx);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateTestSession(uint32_t number) {
  bssl::UniquePtr<SSL_CTX> ssl_ctx(SSL_CTX_new(TLS_method()));
  if (!ssl_ctx) {
    return nullptr;
  }
  bssl::UniquePtr<SSL_SESSION> ret(SSL_SESSION_new(ssl_ctx.get()));
  if (!ret) {
    return nullptr;
  }

  uint8_t id[SSL3_SSL_SESSION_ID_LENGTH] = {0};
  OPENSSL_memcpy(id, &number, sizeof(number));
  if (!SSL_SESSION_set1_id(ret.get(), id, sizeof(id))) {
    return nullptr;
  }
  return ret;
}